

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O3

void __thiscall
mp::BasicFlatModelAPI::
AddConstraint<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
          (BasicFlatModelAPI *this,
          ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *param_1)

{
  Error *this_00;
  long *plVar1;
  long *plVar2;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Not handling constraint type \'","");
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::GetTypeName();
  plVar1 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_70 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (char *)*plVar1;
  plVar2 = plVar1 + 2;
  if ((long *)local_50 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    local_50 = (char *)&local_40;
  }
  else {
    local_40 = *plVar2;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Error::Error(this_00,(CStringRef)local_50,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddConstraint(const Constraint& ) {
    MP_RAISE(
          std::string("Not handling constraint type '") +
          Constraint::GetTypeName() +
          "'. Provide a handler or a converter method");
  }